

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto.hpp
# Opt level: O0

Key __thiscall Keyset::computeKey(Keyset *this,uint32_t seed)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  last;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  ulong uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  uint in_ESI;
  size_type in_RDI;
  Key KVar7;
  uint32_t c4;
  uint32_t c3;
  uint32_t c2;
  uint32_t c1;
  uint32_t c0;
  undefined4 uVar8;
  undefined8 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  uVar2 = (uint32_t)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  std::__cxx11::string::begin();
  std::__cxx11::string::end();
  uVar8 = 0;
  first._M_current._4_4_ = in_stack_ffffffffffffffc4;
  first._M_current._0_4_ = in_stack_ffffffffffffffc0;
  last._M_current._4_4_ = in_stack_ffffffffffffffbc;
  last._M_current._0_4_ = in_stack_ffffffffffffffb8;
  uVar2 = crc32_0x04C11DB7<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    (first,last,uVar2);
  uVar6 = ~(uVar2 ^ in_ESI);
  std::array<unsigned_int,_4UL>::operator[]
            ((array<unsigned_int,_4UL> *)CONCAT44(uVar6,uVar8),in_RDI);
  uVar2 = invXorShift(0,0x14915c);
  std::array<unsigned_int,_4UL>::operator[]
            ((array<unsigned_int,_4UL> *)CONCAT44(uVar6,uVar8),in_RDI);
  uVar3 = invXorShift(0,0x149182);
  std::array<unsigned_int,_4UL>::operator[]
            ((array<unsigned_int,_4UL> *)CONCAT44(uVar6,uVar8),in_RDI);
  uVar4 = invXorShift(0,0x1491a8);
  std::array<unsigned_int,_4UL>::operator[]
            ((array<unsigned_int,_4UL> *)CONCAT44(uVar6,uVar8),in_RDI);
  uVar5 = invXorShift(0,0x1491ce);
  uVar1 = CONCAT44(uVar3,uVar2) & 0x7ffff0001ffff;
  KVar7._M_elems[0] = (int)uVar1;
  KVar7._M_elems[1] = (int)(uVar1 >> 0x20);
  KVar7._M_elems[2] = uVar4 & 0x7fffff;
  KVar7._M_elems[3] = uVar5 & 0x1fffffff;
  return (Key)KVar7._M_elems;
}

Assistant:

const Key computeKey(uint32_t seed) const
	{
		const auto c0 = (~crc32_0x04C11DB7(m_magic.begin(), m_magic.end(), 0)) ^ seed;

		const auto c1 = invXorShift(c0, m_key[0]);
		const auto c2 = invXorShift(c1, m_key[1]);
		const auto c3 = invXorShift(c2, m_key[2]);
		const auto c4 = invXorShift(c3, m_key[3]);

		return Key({{
			c1 & ((1 << 17) - 1),
			c2 & ((1 << 19) - 1),
			c3 & ((1 << 23) - 1),
			c4 & ((1 << 29) - 1),
		}});
	}